

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O0

bool slang::ast::checkSignaturesMatch(SubroutineSymbol *a,SubroutineSymbol *b)

{
  FormalArgumentSymbol *pFVar1;
  FormalArgumentSymbol *pFVar2;
  bool bVar3;
  Type *this;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  *__lhs;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  *p_Var4;
  reference ppFVar5;
  long in_RSI;
  long in_RDI;
  ArgList AVar6;
  FormalArgumentSymbol *bb;
  FormalArgumentSymbol *aa;
  iterator bi;
  iterator ai;
  ArgList bargs;
  ArgList aargs;
  SubroutineSymbol *in_stack_ffffffffffffff78;
  bitmask<slang::ast::MethodFlags> *in_stack_ffffffffffffff80;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_48;
  __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
  local_40;
  Type *local_38;
  __extent_storage<18446744073709551615UL> rhs;
  Type *in_stack_ffffffffffffffd8;
  
  if ((*(int *)(in_RDI + 0xbc) != *(int *)(in_RSI + 0xbc)) ||
     (rhs._M_extent_value = (size_t)local_38,
     bVar3 = bitmask<slang::ast::MethodFlags>::operator==
                       (in_stack_ffffffffffffff80,
                        (bitmask<slang::ast::MethodFlags> *)in_stack_ffffffffffffff78),
     ((bVar3 ^ 0xffU) & 1) != 0)) {
    return false;
  }
  this = SubroutineSymbol::getReturnType((SubroutineSymbol *)0x6022d5);
  SubroutineSymbol::getReturnType((SubroutineSymbol *)0x6022e4);
  bVar3 = Type::isEquivalent(in_stack_ffffffffffffffd8,(Type *)rhs._M_extent_value);
  if (!bVar3) {
    return false;
  }
  AVar6 = SubroutineSymbol::getArguments(in_stack_ffffffffffffff78);
  _local_38 = SubroutineSymbol::getArguments(in_stack_ffffffffffffff78);
  __lhs = (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
           *)std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
                       ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                         *)0x602334);
  p_Var4 = (__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
            *)std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::size
                        ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                          *)0x602343);
  if (__lhs != p_Var4) {
    return false;
  }
  local_40._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78);
  local_48._M_current =
       (FormalArgumentSymbol **)
       std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)
                  in_stack_ffffffffffffff78);
  while( true ) {
    std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::end
              ((span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *)this);
    bVar3 = __gnu_cxx::
            operator==<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                      (__lhs,(__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                              *)in_stack_ffffffffffffff78);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return true;
    }
    ppFVar5 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_40);
    pFVar1 = *ppFVar5;
    ppFVar5 = __gnu_cxx::
              __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
              ::operator*(&local_48);
    pFVar2 = *ppFVar5;
    in_stack_ffffffffffffff78 = (SubroutineSymbol *)ValueSymbol::getType((ValueSymbol *)0x6023d2);
    ValueSymbol::getType((ValueSymbol *)0x6023e0);
    bVar3 = Type::isEquivalent((Type *)AVar6._M_ptr,(Type *)rhs._M_extent_value);
    if (!bVar3) break;
    if (pFVar1->direction != pFVar2->direction) {
      return false;
    }
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  *)this,(int)((ulong)__lhs >> 0x20));
    __gnu_cxx::
    __normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::FormalArgumentSymbol_*const_*,_std::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>_>
                  *)this,(int)((ulong)__lhs >> 0x20));
  }
  return false;
}

Assistant:

static bool checkSignaturesMatch(const SubroutineSymbol& a, const SubroutineSymbol& b) {
    if (a.subroutineKind != b.subroutineKind || a.flags != b.flags)
        return false;

    if (!a.getReturnType().isEquivalent(b.getReturnType()))
        return false;

    auto aargs = a.getArguments();
    auto bargs = b.getArguments();
    if (aargs.size() != bargs.size())
        return false;

    for (auto ai = aargs.begin(), bi = bargs.begin(); ai != aargs.end(); ai++, bi++) {
        auto aa = *ai;
        auto bb = *bi;
        if (!aa->getType().isEquivalent(bb->getType()))
            return false;
        if (aa->direction != bb->direction)
            return false;
    }

    return true;
}